

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.hpp
# Opt level: O0

bitpacking_width_t
duckdb::BitpackingPrimitives::FindMinimumBitWidth<signed_char,true,false>
          (char min_value,char max_value)

{
  char cVar1;
  char in_SIL;
  char in_DIL;
  char value;
  bitpacking_width_t bitwidth;
  undefined1 local_5;
  undefined1 local_4;
  undefined1 local_1;
  
  cVar1 = NumericLimits<signed_char>::Minimum();
  if (in_DIL == cVar1) {
    local_1 = '\b';
  }
  else {
    local_5 = MaxValue<signed_char>(-in_DIL,in_SIL);
    if (local_5 == '\0') {
      local_1 = '\0';
    }
    else {
      local_4 = '\x01';
      for (; local_5 != '\0'; local_5 = local_5 >> 1) {
        local_4 = local_4 + '\x01';
      }
      local_1 = GetEffectiveWidth<signed_char>(local_4);
    }
  }
  return local_1;
}

Assistant:

static bitpacking_width_t FindMinimumBitWidth(T min_value, T max_value) {
		bitpacking_width_t bitwidth;
		T value;

		if (is_signed) {
			if (min_value == NumericLimits<T>::Minimum()) {
				// handle special case of the minimal value, as it cannot be negated like all other values.
				return sizeof(T) * 8;
			} else {
				value = MaxValue((T)-min_value, max_value);
			}
		} else {
			value = max_value;
		}

		if (value == 0) {
			return 0;
		}

		if (is_signed) {
			bitwidth = 1;
		} else {
			bitwidth = 0;
		}

		while (value) {
			bitwidth++;
			value >>= 1;
		}

		bitwidth = GetEffectiveWidth<T>(bitwidth);

		// Assert results are correct
#ifdef DEBUG
		if (bitwidth < sizeof(T) * 8 && bitwidth != 0) {
			if (is_signed) {
				D_ASSERT(max_value <= (T(1) << (bitwidth - 1)) - 1);
				// D_ASSERT(min_value >= (T(-1) * ((T(1) << (bitwidth - 1)) - 1) - 1));
			} else {
				D_ASSERT(max_value <= (T(1) << (bitwidth)) - 1);
			}
		}
#endif
		if (round_to_next_byte) {
			return (bitwidth / 8 + (bitwidth % 8 != 0)) * 8;
		}
		return bitwidth;
	}